

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::matchNextAux
          (GenMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  TermList TVar6;
  char cVar7;
  Binder binder;
  Binder local_20;
  
  local_20._parent = this;
  if ((nodeTerm._content & 3) == 0) {
    if ((*(byte *)(nodeTerm._content + 0x28) & 8) != 0) {
      TVar6._content = nodeTerm._content;
      if (*(int *)(nodeTerm._content + 0xc) < 0) {
        iVar2 = 0;
        do {
          TVar6._content = *(ulong *)(TVar6._content + 0x20);
          if ((TVar6._content & 1) != 0) {
            iVar5 = 3;
            goto LAB_00322549;
          }
          iVar2 = iVar2 + 2;
        } while (*(int *)(TVar6._content + 0xc) < 0);
      }
      else {
        iVar2 = 0;
      }
      iVar5 = *(int *)(TVar6._content + 0x20);
LAB_00322549:
      if (iVar2 + iVar5 == 0) {
        cVar7 = nodeTerm._content == queryTerm._content;
        goto LAB_00322584;
      }
    }
    local_20._maxVar = this->_maxVar;
    if (((queryTerm._content & 3) == 0) &&
       (*(int *)(queryTerm._content + 8) == *(int *)(nodeTerm._content + 8))) {
      cVar7 = Kernel::MatchingUtils::
              matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::Binder>
                        ((Term *)nodeTerm._content,(Term *)queryTerm._content,&local_20);
    }
    else {
      cVar7 = '\0';
    }
  }
  else {
    local_20._maxVar = this->_maxVar;
    iVar2 = Binder::bind(&local_20,(int)(nodeTerm._content >> 2),(sockaddr *)queryTerm._content,
                         local_20._maxVar);
    cVar7 = (char)iVar2;
  }
LAB_00322584:
  if (separate && cVar7 == '\0') {
    puVar3 = (this->_boundVars)._cursor;
    uVar4 = puVar3[-1];
    puVar3 = puVar3 + -1;
    if (uVar4 != 0xffffffff) {
      pAVar1 = (this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
      do {
        pAVar1[uVar4]._timestamp = 0;
        uVar4 = puVar3[-1];
        puVar3 = puVar3 + -1;
      } while (uVar4 != 0xffffffff);
    }
    (this->_boundVars)._cursor = puVar3;
  }
  return (bool)cVar7;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  bool success;
  if(nodeTerm.isTerm()) {
    Term* nt=nodeTerm.term();
    if(nt->shared() && nt->ground()) {
      //ground terms match only iff they're equal
      success = nodeTerm==queryTerm;
    } else {
      Binder binder(this);
      ASS(nt->arity()>0);

      success = queryTerm.isTerm() && queryTerm.term()->functor()==nt->functor() &&
	MatchingUtils::matchArgs(nt, queryTerm.term(), binder);
    }
  } else {
    ASS_METHOD(nodeTerm,isOrdinaryVar());
    unsigned var=nodeTerm.var();
    Binder binder(this);
    success=binder.bind(var,queryTerm);
  }

  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind ordinary variables, that were bound.
      for(;;) {
	unsigned boundVar = _boundVars.pop();
	if(boundVar==BACKTRACK_SEPARATOR) {
	  break;
	}
	_bindings.remove(boundVar);
      }
    }
  }

  return success;
}